

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  undefined1 auVar11 [16];
  ZeroObjColSingletonPS *pZVar12;
  ZeroObjColSingletonPS *pZVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  bool bVar16;
  int *piVar17;
  int iVar18;
  double *pdVar19;
  undefined8 *puVar20;
  ulong *puVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  int *piVar24;
  bool *pbVar25;
  uint *puVar26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar27;
  VarStatus **ppVVar29;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar30;
  cpp_dec_float<50U,_int,_void> *pcVar31;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar32;
  VarStatus VVar33;
  ulong uVar34;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_20;
  undefined1 local_6d8 [48];
  int *local_6a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a0;
  ZeroObjColSingletonPS *local_698;
  undefined8 uStack_690;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_680;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_678;
  int *local_670;
  cpp_dec_float<50U,_int,_void> *local_668;
  undefined8 uStack_660;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_650;
  cpp_dec_float<50U,_int,_void> local_648;
  cpp_dec_float<50U,_int,_void> local_610;
  cpp_dec_float<50U,_int,_void> *local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [48];
  int *local_598;
  undefined1 local_588 [48];
  int *local_558;
  cpp_dec_float<50U,_int,_void> local_548;
  cpp_dec_float<50U,_int,_void> local_508;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d0;
  cpp_dec_float<50U,_int,_void> local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  undefined1 local_448 [48];
  int *local_418;
  cpp_dec_float<50U,_int,_void> local_408;
  uint local_3c8 [2];
  long lStack_3c0;
  uint local_3b8 [2];
  undefined8 uStack_3b0;
  uint local_3a8 [4];
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  undefined8 uStack_380;
  undefined8 local_378;
  uint local_368 [2];
  uint auStack_360 [2];
  uint local_358 [2];
  undefined8 uStack_350;
  uint local_348 [4];
  uint local_338 [2];
  uint auStack_330 [2];
  uint local_328 [2];
  undefined8 uStack_320;
  undefined8 local_318;
  uint local_308 [2];
  long lStack_300;
  uint local_2f8 [2];
  uint uStack_2f0;
  undefined3 uStack_2eb;
  uint local_2e8;
  undefined3 uStack_2e3;
  uint local_2d8 [2];
  uint auStack_2d0 [2];
  uint local_2c8 [2];
  uint uStack_2c0;
  undefined3 uStack_2bb;
  uint local_2b8;
  undefined3 uStack_2b3;
  uint local_2a8 [2];
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288 [4];
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  uint auStack_260 [2];
  uint local_258 [4];
  undefined8 local_248;
  undefined8 uStack_240;
  uint local_238 [2];
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  uint local_208 [2];
  undefined8 uStack_200;
  undefined8 local_1f8;
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined1 local_1b8 [29];
  undefined3 uStack_19b;
  undefined1 auStack_198 [13];
  undefined8 local_188;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  undefined7 uVar28;
  
  pcVar22 = (cpp_dec_float<50U,_int,_void> *)local_6d8;
  pcVar31 = (cpp_dec_float<50U,_int,_void> *)local_6d8;
  iVar18 = this->m_j;
  iVar4 = this->m_old_j;
  if (iVar18 != iVar4) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar18].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2);
    puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar26 + 2);
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar26;
    *(undefined8 *)(puVar2 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar18].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar18].m_backend.neg;
    iVar10 = pnVar5[iVar18].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar18].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    iVar18 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_j;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar18].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2);
    puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)(puVar26 + 2);
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar26;
    *(undefined8 *)(puVar2 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar18].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar18].m_backend.neg;
    iVar10 = pnVar5[iVar18].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar18].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar10;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_678 = cStatus;
  local_650 = s;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_610,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar18 = this->m_i;
  pnVar5 = (local_650->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8);
  local_1e8 = pnVar5[iVar18].m_backend.data._M_elems[0];
  auStack_1e0 = *(uint (*) [2])(pnVar5[iVar18].m_backend.data._M_elems + 2);
  puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
  local_1d8 = *(uint (*) [2])puVar26;
  uStack_1d0 = *(undefined8 *)(puVar26 + 2);
  iVar4 = pnVar5[iVar18].m_backend.exp;
  bVar3 = pnVar5[iVar18].m_backend.neg;
  uVar7._0_4_ = pnVar5[iVar18].m_backend.fpclass;
  uVar7._4_4_ = pnVar5[iVar18].m_backend.prec_elem;
  uStack_660 = 0;
  local_188._0_4_ = cpp_dec_float_finite;
  local_188._4_4_ = 10;
  local_1b8._16_13_ = SUB1613((undefined1  [16])0x0,0);
  uStack_19b = 0;
  auStack_198 = SUB1613((undefined1  [16])0x0,3);
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_698 = this;
  local_668 = (cpp_dec_float<50U,_int,_void> *)uVar7;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_1b8,1e-06);
  local_6d8._32_5_ = (undefined5)local_1c8;
  local_6d8._37_3_ = (undefined3)((ulong)local_1c8 >> 0x28);
  local_6d8._16_4_ = local_1d8[0];
  local_6d8._20_4_ = local_1d8[1];
  local_6d8._24_5_ = (undefined5)uStack_1d0;
  local_6d8._29_3_ = (undefined3)((ulong)uStack_1d0 >> 0x28);
  local_6d8._0_4_ = local_1e8[0];
  local_6d8._4_4_ = local_1e8[1];
  uVar8 = local_6d8._0_8_;
  local_6d8._8_4_ = auStack_1e0[0];
  local_6d8._12_4_ = auStack_1e0[1];
  local_6d8[0x2c] = bVar3;
  if ((bVar3 == true) &&
     (local_6d8._0_4_ = local_1e8[0],
     local_6d8._0_4_ != 0 || (fpclass_type)local_668 != cpp_dec_float_finite)) {
    local_6d8[0x2c] = false;
  }
  piVar24 = &local_698->m_i;
  local_6d8._40_4_ = iVar4;
  local_6a8 = (int *)uVar7;
  local_6d8._0_8_ = uVar8;
  if ((((fpclass_type)local_668 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_188 == cpp_dec_float_NaN)) ||
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6d8,
                          (cpp_dec_float<50U,_int,_void> *)local_1b8), 0 < iVar18)) {
    pcVar23 = &(local_650->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar24].m_backend;
    ::soplex::infinity::__tls_init();
    pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_4_ = 0;
    local_6d8._4_4_ = 0;
    local_6d8._8_8_ = 0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,*pdVar19);
    if (((pcVar23->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_6a8 != cpp_dec_float_NaN))
       && (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar23,(cpp_dec_float<50U,_int,_void> *)local_6d8), -1 < iVar18)) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_6d8._0_8_ = local_6d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6d8,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar20 = &PTR__SPxException_003af870;
      puVar20[1] = puVar20 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar20 + 1),local_6d8._0_8_,
                 (undefined1 *)(local_6d8._0_8_ + local_6d8._8_8_));
      __cxa_throw(puVar20,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((local_650->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *piVar24),0.0);
  }
  local_6d8[0x2c] = (local_698->m_lhs).m_backend.neg;
  iVar18 = local_698->m_i;
  pnVar6 = (local_650->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_6a8._0_4_ = (local_698->m_lhs).m_backend.fpclass;
  local_6a8._4_4_ = (local_698->m_lhs).m_backend.prec_elem;
  local_1f8 = *(undefined8 *)(pnVar6[iVar18].m_backend.data._M_elems + 8);
  pnVar5 = pnVar6 + iVar18;
  local_218 = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
  uStack_210 = *(undefined8 *)((pnVar5->m_backend).data._M_elems + 2);
  puVar26 = pnVar6[iVar18].m_backend.data._M_elems + 4;
  local_208 = *(uint (*) [2])puVar26;
  uStack_200 = *(undefined8 *)(puVar26 + 2);
  local_648.neg = pnVar6[iVar18].m_backend.neg;
  local_648.fpclass = pnVar6[iVar18].m_backend.fpclass;
  local_648.prec_elem = pnVar6[iVar18].m_backend.prec_elem;
  uVar7 = *(undefined8 *)((local_698->m_lhs).m_backend.data._M_elems + 8);
  local_6d8._32_5_ = (undefined5)uVar7;
  local_6d8._37_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  uVar7 = *(undefined8 *)((local_698->m_lhs).m_backend.data._M_elems + 6);
  local_6d8._16_8_ = *(undefined8 *)((local_698->m_lhs).m_backend.data._M_elems + 4);
  local_6d8._24_5_ = (undefined5)uVar7;
  local_6d8._29_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_6d8._0_16_ = *(undefined1 (*) [16])(local_698->m_lhs).m_backend.data._M_elems;
  auVar11 = local_6d8._0_16_;
  local_6d8._40_4_ = (local_698->m_lhs).m_backend.exp;
  if ((local_6d8[0x2c] == true) &&
     (local_6d8._0_4_ = (undefined4)*(undefined8 *)(local_698->m_lhs).m_backend.data._M_elems,
     local_6d8._0_4_ != 0 || (fpclass_type)local_6a8 != 0)) {
    local_6d8[0x2c] = false;
  }
  local_648.data._M_elems._32_5_ = SUB85(local_1f8,0);
  local_648.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1f8 >> 0x28);
  local_648.data._M_elems[4] = local_208[0];
  local_648.data._M_elems[5] = local_208[1];
  local_648.data._M_elems._24_5_ = SUB85(uStack_200,0);
  local_648.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_200 >> 0x28);
  local_648.data._M_elems._0_16_ = *(undefined1 (*) [16])&(pnVar5->m_backend).data;
  auVar14 = (undefined1  [16])local_648.data._M_elems._0_16_;
  local_648.exp = pnVar6[iVar18].m_backend.exp;
  if ((local_648.neg != false) &&
     (local_648.data._M_elems[0] = (uint)local_218,
     local_648.data._M_elems[0] != 0 || local_648.fpclass != 0)) {
    local_648.neg = (bool)(local_648.neg ^ 1);
  }
  bVar3 = false;
  local_670 = piVar24;
  local_680 = r;
  local_4d0 = y;
  if (((fpclass_type)local_6a8 != 2) && (local_648.fpclass != 2)) {
    local_6d8._0_16_ = auVar11;
    local_648.data._M_elems._0_16_ = auVar14;
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_648);
    bVar3 = 0 < iVar18;
  }
  pcVar23 = &local_648;
  if (bVar3) {
    pcVar23 = (cpp_dec_float<50U,_int,_void> *)local_6d8;
  }
  local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
  local_488.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
  local_488.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
  local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
  local_488.data._M_elems._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
  piVar24 = &local_648.exp;
  if (bVar3) {
    piVar24 = (int *)(local_6d8 + 0x28);
  }
  local_488.exp = *piVar24;
  pbVar25 = &local_648.neg;
  if (bVar3) {
    pbVar25 = (bool *)(local_6d8 + 0x2c);
  }
  local_488.neg = *pbVar25;
  uVar34 = CONCAT44((int)((uint)bVar3 << 0x1f) >> 0x1f,(int)((uint)bVar3 << 0x1f) >> 0x1f);
  local_488._48_8_ = ~uVar34 & local_648._48_8_ | (ulong)local_6a8 & uVar34;
  local_6d8[0x2c] = (local_698->m_rhs).m_backend.neg;
  iVar18 = local_698->m_i;
  pnVar6 = (local_650->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_6a8._0_4_ = (local_698->m_rhs).m_backend.fpclass;
  local_6a8._4_4_ = (local_698->m_rhs).m_backend.prec_elem;
  local_228 = *(undefined8 *)(pnVar6[iVar18].m_backend.data._M_elems + 8);
  pnVar5 = pnVar6 + iVar18;
  local_248 = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
  uStack_240 = *(undefined8 *)((pnVar5->m_backend).data._M_elems + 2);
  puVar26 = pnVar6[iVar18].m_backend.data._M_elems + 4;
  local_238 = *(uint (*) [2])puVar26;
  uStack_230 = *(undefined8 *)(puVar26 + 2);
  local_648.neg = pnVar6[iVar18].m_backend.neg;
  local_648.fpclass = pnVar6[iVar18].m_backend.fpclass;
  local_648.prec_elem = pnVar6[iVar18].m_backend.prec_elem;
  uVar7 = *(undefined8 *)((local_698->m_rhs).m_backend.data._M_elems + 8);
  local_6d8._32_5_ = (undefined5)uVar7;
  local_6d8._37_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  uVar7 = *(undefined8 *)((local_698->m_rhs).m_backend.data._M_elems + 6);
  local_6d8._16_8_ = *(undefined8 *)((local_698->m_rhs).m_backend.data._M_elems + 4);
  local_6d8._24_5_ = (undefined5)uVar7;
  local_6d8._29_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_6d8._0_16_ = *(undefined1 (*) [16])(local_698->m_rhs).m_backend.data._M_elems;
  auVar11 = local_6d8._0_16_;
  local_6d8._40_4_ = (local_698->m_rhs).m_backend.exp;
  if ((local_6d8[0x2c] == true) &&
     (local_6d8._0_4_ = (undefined4)*(undefined8 *)(local_698->m_rhs).m_backend.data._M_elems,
     local_6d8._0_4_ != 0 || (fpclass_type)local_6a8 != 0)) {
    local_6d8[0x2c] = false;
  }
  local_648.data._M_elems._32_5_ = SUB85(local_228,0);
  local_648.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_228 >> 0x28);
  local_648.data._M_elems[4] = local_238[0];
  local_648.data._M_elems[5] = local_238[1];
  local_648.data._M_elems._24_5_ = SUB85(uStack_230,0);
  local_648.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_230 >> 0x28);
  local_648.data._M_elems._0_16_ = *(undefined1 (*) [16])&(pnVar5->m_backend).data;
  auVar14 = (undefined1  [16])local_648.data._M_elems._0_16_;
  local_648.exp = pnVar6[iVar18].m_backend.exp;
  if ((local_648.neg != false) &&
     (local_648.data._M_elems[0] = (uint)local_248,
     local_648.data._M_elems[0] != 0 || local_648.fpclass != 0)) {
    local_648.neg = (bool)(local_648.neg ^ 1);
  }
  bVar3 = false;
  local_648.data._M_elems._0_16_ = auVar14;
  if (((fpclass_type)local_6a8 != 2) && (local_648.fpclass != 2)) {
    local_6d8._0_16_ = auVar11;
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_648);
    bVar3 = 0 < iVar18;
  }
  pcVar23 = &local_648;
  if (bVar3) {
    pcVar23 = (cpp_dec_float<50U,_int,_void> *)local_6d8;
  }
  local_4c8.data._M_elems._32_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 8);
  local_4c8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
  local_4c8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
  local_4c8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
  local_4c8.data._M_elems._24_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 6);
  piVar24 = &local_648.exp;
  if (bVar3) {
    piVar24 = (int *)(local_6d8 + 0x28);
  }
  local_4c8.exp = *piVar24;
  pbVar25 = &local_648.neg;
  if (bVar3) {
    pbVar25 = (bool *)(local_6d8 + 0x2c);
  }
  local_4c8.neg = *pbVar25;
  uVar34 = CONCAT44((int)((uint)bVar3 << 0x1f) >> 0x1f,(int)((uint)bVar3 << 0x1f) >> 0x1f);
  local_4c8._48_8_ = ~uVar34 & local_648._48_8_ | (ulong)local_6a8 & uVar34;
  if (local_488.fpclass != cpp_dec_float_NaN) {
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,1.0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_488,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (iVar18 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_488,1.0);
    }
  }
  pZVar12 = local_698;
  pnVar27 = &local_698->m_lhs;
  local_668 = &(local_698->m_rhs).m_backend;
  local_6a0 = x;
  if (local_4c8.fpclass != cpp_dec_float_NaN) {
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,1.0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_4c8,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (iVar18 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_4c8,1.0);
    }
  }
  local_6a8 = (int *)0xa00000000;
  local_6d8._0_16_ = (undefined1  [16])0x0;
  local_6d8._16_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._24_5_ = 0;
  local_6d8._29_3_ = 0;
  local_6d8._32_5_ = 0;
  local_6d8._37_3_ = 0;
  local_6d8._40_4_ = 0;
  local_6d8[0x2c] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_6d8,&pnVar27->m_backend,&local_488);
  pVVar32 = local_650;
  local_648.fpclass = cpp_dec_float_finite;
  local_648.prec_elem = 10;
  local_648.data._M_elems[0] = 0;
  local_648.data._M_elems[1] = 0;
  local_648.data._M_elems[2] = 0;
  local_648.data._M_elems[3] = 0;
  local_648.data._M_elems[4] = 0;
  local_648.data._M_elems[5] = 0;
  local_648.data._M_elems._24_5_ = 0;
  local_648.data._M_elems[7]._1_3_ = 0;
  local_648.data._M_elems._32_5_ = 0;
  local_648.data._M_elems[9]._1_3_ = 0;
  local_648.exp = 0;
  local_648.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_648,
             &(local_650->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[pZVar12->m_i].m_backend,&local_488);
  auVar11 = local_6d8._0_16_;
  local_508.data._M_elems[7]._1_3_ = local_6d8._29_3_;
  local_508.data._M_elems._24_5_ = local_6d8._24_5_;
  local_508.data._M_elems[0] = local_6d8._0_4_;
  local_508.data._M_elems[1] = local_6d8._4_4_;
  local_508.data._M_elems[2] = local_6d8._8_4_;
  local_508.data._M_elems[3] = local_6d8._12_4_;
  local_508.data._M_elems[4] = local_6d8._16_4_;
  local_508.data._M_elems[5] = local_6d8._20_4_;
  local_508.data._M_elems[9]._1_3_ = local_6d8._37_3_;
  local_508.data._M_elems._32_5_ = local_6d8._32_5_;
  local_508.exp = local_6d8._40_4_;
  local_508.neg = local_6d8[0x2c];
  local_508._48_8_ = local_6a8;
  local_6d8._0_16_ = auVar11;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_508,&local_648);
  local_6a8 = (int *)0xa00000000;
  local_6d8._0_16_ = ZEXT816(0);
  local_6d8._16_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._24_5_ = 0;
  local_6d8._29_3_ = 0;
  local_6d8._32_5_ = 0;
  local_6d8._37_3_ = 0;
  local_6d8._40_4_ = 0;
  local_6d8[0x2c] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_6d8,local_668,&local_4c8);
  pZVar12 = local_698;
  local_648.fpclass = cpp_dec_float_finite;
  local_648.prec_elem = 10;
  local_648.data._M_elems[0] = 0;
  local_648.data._M_elems[1] = 0;
  local_648.data._M_elems[2] = 0;
  local_648.data._M_elems[3] = 0;
  local_648.data._M_elems[4] = 0;
  local_648.data._M_elems[5] = 0;
  local_648.data._M_elems._24_5_ = 0;
  local_648.data._M_elems[7]._1_3_ = 0;
  local_648.data._M_elems._32_5_ = 0;
  local_648.data._M_elems[9]._1_3_ = 0;
  local_648.exp = 0;
  local_648.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_648,
             &(pVVar32->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_698->m_i].m_backend,&local_4c8);
  auVar11 = local_6d8._0_16_;
  local_548.data._M_elems[7]._1_3_ = local_6d8._29_3_;
  local_548.data._M_elems._24_5_ = local_6d8._24_5_;
  local_548.data._M_elems[0] = local_6d8._0_4_;
  local_548.data._M_elems[1] = local_6d8._4_4_;
  local_548.data._M_elems[2] = local_6d8._8_4_;
  local_548.data._M_elems[3] = local_6d8._12_4_;
  local_548.data._M_elems[4] = local_6d8._16_4_;
  local_548.data._M_elems[5] = local_6d8._20_4_;
  local_548.data._M_elems[9]._1_3_ = local_6d8._37_3_;
  local_548.data._M_elems._32_5_ = local_6d8._32_5_;
  local_548.exp = local_6d8._40_4_;
  local_548.neg = local_6d8[0x2c];
  local_548._48_8_ = local_6a8;
  local_6d8._0_16_ = auVar11;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_548,&local_648);
  uVar8 = local_508._48_8_;
  bVar3 = local_508.neg;
  iVar18 = local_508.exp;
  local_278[0] = local_508.data._M_elems[0];
  local_278[1] = local_508.data._M_elems[1];
  auStack_270[0] = local_508.data._M_elems[2];
  auStack_270[1] = local_508.data._M_elems[3];
  local_268[0] = local_508.data._M_elems[4];
  local_268[1] = local_508.data._M_elems[5];
  auStack_260[0] = local_508.data._M_elems[6];
  auStack_260[1] = local_508.data._M_elems[7];
  local_258[0] = local_508.data._M_elems[8];
  local_258[1] = local_508.data._M_elems[9];
  local_668 = (cpp_dec_float<50U,_int,_void> *)local_508._48_8_;
  uStack_660 = 0;
  (*(pZVar12->super_PostStep)._vptr_PostStep[7])(&local_a0,pZVar12);
  local_6d8._32_5_ = (undefined5)local_258._0_8_;
  local_6d8._37_3_ = SUB83(local_258._0_8_,5);
  local_6d8._16_4_ = local_268[0];
  local_6d8._20_4_ = local_268[1];
  local_6d8._24_5_ = auStack_260._0_5_;
  local_6d8._29_3_ = auStack_260[1]._1_3_;
  local_6d8._0_4_ = local_278[0];
  local_6d8._4_4_ = local_278[1];
  uVar7 = local_6d8._0_8_;
  local_6d8._8_4_ = auStack_270[0];
  local_6d8._12_4_ = auStack_270[1];
  local_6d8._40_4_ = iVar18;
  local_6d8[0x2c] = bVar3;
  local_6a8 = (int *)uVar8;
  if ((bVar3 == true) &&
     (local_6d8._0_4_ = local_278[0],
     local_6d8._0_4_ != 0 || (fpclass_type)local_668 != cpp_dec_float_finite)) {
    local_6d8[0x2c] = false;
  }
  local_6d8._0_8_ = uVar7;
  if ((((fpclass_type)local_668 != cpp_dec_float_NaN) && (local_a0.fpclass != cpp_dec_float_NaN)) &&
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_a0), iVar18 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_508,0.0);
  }
  uVar8 = local_548._48_8_;
  bVar3 = local_548.neg;
  iVar18 = local_548.exp;
  local_288[0] = local_548.data._M_elems[8];
  local_288[1] = local_548.data._M_elems[9];
  local_298[0] = local_548.data._M_elems[4];
  local_298[1] = local_548.data._M_elems[5];
  auStack_290[0] = local_548.data._M_elems[6];
  auStack_290[1] = local_548.data._M_elems[7];
  local_2a8[0] = local_548.data._M_elems[0];
  local_2a8[1] = local_548.data._M_elems[1];
  auStack_2a0[0] = local_548.data._M_elems[2];
  auStack_2a0[1] = local_548.data._M_elems[3];
  local_668 = (cpp_dec_float<50U,_int,_void> *)local_548._48_8_;
  uStack_660 = 0;
  (*(pZVar12->super_PostStep)._vptr_PostStep[7])(&local_d8);
  local_6d8._32_5_ = (undefined5)local_288._0_8_;
  local_6d8._37_3_ = SUB83(local_288._0_8_,5);
  local_6d8._16_4_ = local_298[0];
  local_6d8._20_4_ = local_298[1];
  local_6d8._24_5_ = auStack_290._0_5_;
  local_6d8._29_3_ = auStack_290[1]._1_3_;
  local_6d8._0_4_ = local_2a8[0];
  local_6d8._4_4_ = local_2a8[1];
  uVar7 = local_6d8._0_8_;
  local_6d8._8_4_ = auStack_2a0[0];
  local_6d8._12_4_ = auStack_2a0[1];
  local_6d8._40_4_ = iVar18;
  local_6d8[0x2c] = bVar3;
  local_6a8 = (int *)uVar8;
  if ((bVar3 == true) &&
     (local_6d8._0_4_ = local_2a8[0],
     local_6d8._0_4_ != 0 || (fpclass_type)local_668 != cpp_dec_float_finite)) {
    local_6d8[0x2c] = false;
  }
  local_6d8._0_8_ = uVar7;
  if ((((fpclass_type)local_668 != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_d8), iVar18 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_548,0.0);
  }
  if (local_610.fpclass == cpp_dec_float_NaN) {
LAB_0032d21d:
    pcVar22 = &local_648;
    local_648.data._M_elems[0] = local_548.data._M_elems[0];
    local_648.data._M_elems[1] = local_548.data._M_elems[1];
    local_648.data._M_elems[2] = local_548.data._M_elems[2];
    local_648.data._M_elems[3] = local_548.data._M_elems[3];
    local_648.data._M_elems[4] = local_548.data._M_elems[4];
    local_648.data._M_elems[5] = local_548.data._M_elems[5];
    local_648.data._M_elems._24_5_ = local_548.data._M_elems._24_5_;
    local_648.data._M_elems[7]._1_3_ = local_548.data._M_elems[7]._1_3_;
    local_648.data._M_elems._32_5_ = local_548.data._M_elems._32_5_;
    local_648.data._M_elems[9]._1_3_ = local_548.data._M_elems[9]._1_3_;
    local_648.exp = local_548.exp;
    local_648.neg = local_548.neg;
    local_648.fpclass = local_548.fpclass;
    local_648.prec_elem = local_548.prec_elem;
    pcVar23 = &local_4c8;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (iVar18 < 1) goto LAB_0032d21d;
    local_6d8._0_4_ = local_508.data._M_elems[0];
    local_6d8._4_4_ = local_508.data._M_elems[1];
    local_6d8._8_4_ = local_508.data._M_elems[2];
    local_6d8._12_4_ = local_508.data._M_elems[3];
    local_6d8._16_4_ = local_508.data._M_elems[4];
    local_6d8._20_4_ = local_508.data._M_elems[5];
    local_6d8._24_5_ = local_508.data._M_elems._24_5_;
    local_6d8._29_3_ = local_508.data._M_elems[7]._1_3_;
    local_6d8._32_5_ = local_508.data._M_elems._32_5_;
    local_6d8._37_3_ = local_508.data._M_elems[9]._1_3_;
    local_6d8._40_4_ = local_508.exp;
    local_6d8[0x2c] = local_508.neg;
    local_6a8 = (int *)local_508._48_8_;
    pcVar23 = &local_488;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar22,pcVar23);
  local_558 = (int *)0xa00000000;
  local_588._0_4_ = 0;
  local_588._4_4_ = 0;
  local_588._8_4_ = 0;
  local_588._12_4_ = 0;
  local_588._16_4_ = 0;
  local_588._20_4_ = 0;
  local_588._24_5_ = 0;
  local_588._29_3_ = 0;
  local_588._32_5_ = 0;
  local_588._37_3_ = 0;
  local_588._40_4_ = 0;
  local_588[0x2c] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_588,pcVar22,&local_610);
  if (local_610.fpclass == cpp_dec_float_NaN) {
LAB_0032d32c:
    pcVar31 = &local_648;
    local_648.data._M_elems[0] = local_508.data._M_elems[0];
    local_648.data._M_elems[1] = local_508.data._M_elems[1];
    local_648.data._M_elems[2] = local_508.data._M_elems[2];
    local_648.data._M_elems[3] = local_508.data._M_elems[3];
    local_648.data._M_elems[4] = local_508.data._M_elems[4];
    local_648.data._M_elems[5] = local_508.data._M_elems[5];
    local_648.data._M_elems._24_5_ = local_508.data._M_elems._24_5_;
    local_648.data._M_elems[7]._1_3_ = local_508.data._M_elems[7]._1_3_;
    local_648.data._M_elems._32_5_ = local_508.data._M_elems._32_5_;
    local_648.data._M_elems[9]._1_3_ = local_508.data._M_elems[9]._1_3_;
    local_648.exp = local_508.exp;
    local_648.neg = local_508.neg;
    local_648.fpclass = local_508.fpclass;
    local_648.prec_elem = local_508.prec_elem;
    pcVar22 = &local_488;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (iVar18 < 1) goto LAB_0032d32c;
    local_6d8._0_4_ = local_548.data._M_elems[0];
    local_6d8._4_4_ = local_548.data._M_elems[1];
    local_6d8._8_4_ = local_548.data._M_elems[2];
    local_6d8._12_4_ = local_548.data._M_elems[3];
    local_6d8._16_4_ = local_548.data._M_elems[4];
    local_6d8._20_4_ = local_548.data._M_elems[5];
    local_6d8._24_5_ = local_548.data._M_elems._24_5_;
    local_6d8._29_3_ = local_548.data._M_elems[7]._1_3_;
    local_6d8._32_5_ = local_548.data._M_elems._32_5_;
    local_6d8._37_3_ = local_548.data._M_elems[9]._1_3_;
    local_6d8._40_4_ = local_548.exp;
    local_6d8[0x2c] = local_548.neg;
    local_6a8 = (int *)local_548._48_8_;
    pcVar22 = &local_4c8;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar31,pcVar22);
  local_598 = (int *)0xa00000000;
  local_5c8._0_4_ = 0;
  local_5c8._4_4_ = 0;
  local_5c8._8_8_ = 0;
  local_5c8._16_4_ = 0;
  local_5c8._20_4_ = 0;
  local_5c8._24_5_ = 0;
  local_5c8._29_3_ = 0;
  local_5c8._32_5_ = 0;
  local_5c8._37_3_ = 0;
  local_5c8._40_4_ = 0;
  local_5c8[0x2c] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_5c8,pcVar31,&local_610);
  piVar24 = local_558;
  bVar3 = local_588[0x2c];
  uVar15 = local_588._40_4_;
  _uStack_2c0 = local_588._24_5_;
  uStack_2bb = local_588._29_3_;
  local_2d8[0] = local_588._0_4_;
  local_2d8[1] = local_588._4_4_;
  auStack_2d0[0] = local_588._8_4_;
  auStack_2d0[1] = local_588._12_4_;
  local_2c8[0] = local_588._16_4_;
  local_2c8[1] = local_588._20_4_;
  _local_2b8 = local_588._32_5_;
  uStack_2b3 = local_588._37_3_;
  local_668 = (cpp_dec_float<50U,_int,_void> *)local_558;
  uStack_660 = 0;
  (*(pZVar12->super_PostStep)._vptr_PostStep[6])(&local_110,pZVar12);
  local_6d8._32_5_ = _local_2b8;
  local_6d8._37_3_ = uStack_2b3;
  local_6d8._16_4_ = local_2c8[0];
  local_6d8._20_4_ = local_2c8[1];
  local_6d8._24_5_ = _uStack_2c0;
  local_6d8._29_3_ = uStack_2bb;
  local_6d8._0_4_ = local_2d8[0];
  local_6d8._4_4_ = local_2d8[1];
  uVar7 = local_6d8._0_8_;
  local_6d8._8_4_ = auStack_2d0[0];
  local_6d8._12_4_ = auStack_2d0[1];
  local_6d8._40_4_ = uVar15;
  local_6d8[0x2c] = bVar3;
  local_6a8 = piVar24;
  if ((bVar3 == true) &&
     (local_6d8._0_4_ = local_2d8[0], local_6d8._0_4_ != 0 || (fpclass_type)local_668 != 0)) {
    local_6d8[0x2c] = false;
  }
  local_6d8._0_8_ = uVar7;
  if ((((fpclass_type)local_668 != 2) && (local_110.fpclass != cpp_dec_float_NaN)) &&
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_110), iVar18 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_588,0.0);
  }
  piVar17 = local_598;
  bVar3 = local_5c8[0x2c];
  uVar15 = local_5c8._40_4_;
  _local_2e8 = local_5c8._32_5_;
  uStack_2e3 = local_5c8._37_3_;
  _uStack_2f0 = local_5c8._24_5_;
  uStack_2eb = local_5c8._29_3_;
  local_2f8[0] = local_5c8._16_4_;
  local_2f8[1] = local_5c8._20_4_;
  local_308[0] = local_5c8._0_4_;
  local_308[1] = local_5c8._4_4_;
  lStack_300 = local_5c8._8_8_;
  local_668 = (cpp_dec_float<50U,_int,_void> *)local_598;
  uStack_660 = 0;
  (*(pZVar12->super_PostStep)._vptr_PostStep[6])(&local_148);
  piVar24 = local_670;
  local_6d8._32_5_ = _local_2e8;
  local_6d8._37_3_ = uStack_2e3;
  local_6d8._16_4_ = local_2f8[0];
  local_6d8._20_4_ = local_2f8[1];
  local_6d8._24_5_ = _uStack_2f0;
  local_6d8._29_3_ = uStack_2eb;
  local_6d8._0_4_ = local_308[0];
  local_6d8._4_4_ = local_308[1];
  uVar7 = local_6d8._0_8_;
  local_6d8._8_8_ = lStack_300;
  local_6d8._40_4_ = uVar15;
  local_6d8[0x2c] = bVar3;
  local_6a8 = piVar17;
  if ((bVar3 == true) &&
     (local_6d8._0_4_ = local_308[0], local_6d8._0_4_ != 0 || (fpclass_type)local_668 != 0)) {
    local_6d8[0x2c] = false;
  }
  local_6d8._0_8_ = uVar7;
  if ((((fpclass_type)local_668 != 2) && (local_148.fpclass != cpp_dec_float_NaN)) &&
     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_148), iVar18 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_5c8,0.0);
  }
  piVar17 = local_558;
  uVar15 = local_588._40_4_;
  if (BASIC < rStatus->data[*piVar24]) {
switchD_0032d5d1_caseD_3:
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_6d8._0_8_ = local_6d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6d8,"XMAISM04 This should never happen.","");
    *puVar20 = &PTR__SPxException_003af870;
    puVar20[1] = puVar20 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar20 + 1),local_6d8._0_8_,
               (undefined1 *)(local_6d8._0_8_ + local_6d8._8_8_));
    *puVar20 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pcVar22 = (cpp_dec_float<50U,_int,_void> *)&pZVar12->m_j;
  puVar26 = &switchD_0032d5d1::switchdataD_00359240;
  local_668 = pcVar22;
  switch(rStatus->data[*piVar24]) {
  case ON_UPPER:
    ::soplex::infinity::__tls_init();
    pnVar27 = &pZVar12->m_lower;
    pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_5d8 = (cpp_dec_float<50U,_int,_void> *)*pdVar19;
    uStack_5d0 = 0;
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,-(double)local_5d8);
    if ((((pZVar12->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar27->m_backend,(cpp_dec_float<50U,_int,_void> *)local_6d8),
       iVar18 < 1)) {
      ::soplex::infinity::__tls_init();
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 10;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems._24_5_ = 0;
      local_648.data._M_elems[7]._1_3_ = 0;
      local_648.data._M_elems._32_5_ = 0;
      local_648.data._M_elems[9]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_648,(double)local_5d8);
      if ((((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_648.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(local_698->m_upper).m_backend,&local_648), -1 < iVar18)) {
LAB_0032e7fc:
        pVVar30 = local_6a0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((local_6a0->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(int *)pcVar22),0.0);
        ppVVar29 = &local_678->data;
        VVar33 = ZERO;
        pcVar31 = pcVar22;
        pVVar32 = local_680;
        goto LAB_0032e42f;
      }
    }
    pZVar13 = local_698;
    pnVar1 = &local_698->m_upper;
    if ((((local_698->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar27->m_backend,&pnVar1->m_backend), iVar18 == 0)) {
LAB_0032e3be:
      iVar18 = local_698->m_j;
      pnVar5 = (local_6a0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
           *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
      uVar7 = *(undefined8 *)(pZVar12->m_lower).m_backend.data._M_elems;
      uVar8 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 2);
      uVar9 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
      puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar26 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar26 + 2) = uVar9;
      *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
      *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
      pnVar5[iVar18].m_backend.exp = (local_698->m_lower).m_backend.exp;
      pnVar5[iVar18].m_backend.neg = (local_698->m_lower).m_backend.neg;
      iVar10 = (local_698->m_lower).m_backend.prec_elem;
      pnVar5[iVar18].m_backend.fpclass = (local_698->m_lower).m_backend.fpclass;
      pnVar5[iVar18].m_backend.prec_elem = iVar10;
      ppVVar29 = &local_678->data;
      VVar33 = FIXED;
      pcVar22 = local_668;
      pVVar30 = local_6a0;
      pcVar31 = local_668;
      pVVar32 = local_680;
      goto LAB_0032e42f;
    }
    if (local_610.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
      piVar24 = local_670;
      iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
      if (0 < iVar18) {
        iVar18 = local_698->m_j;
        pnVar5 = (local_6a0->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
             *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
        uVar7 = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
        uVar8 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 2);
        uVar9 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
        puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar26 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar26 + 2) = uVar9;
        *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
        pnVar5[iVar18].m_backend.exp = (local_698->m_lower).m_backend.exp;
        pnVar5[iVar18].m_backend.neg = (local_698->m_lower).m_backend.neg;
        iVar10 = (local_698->m_lower).m_backend.prec_elem;
        pnVar5[iVar18].m_backend.fpclass = (local_698->m_lower).m_backend.fpclass;
        pnVar5[iVar18].m_backend.prec_elem = iVar10;
        ppVVar29 = &local_678->data;
        VVar33 = ON_LOWER;
        pcVar22 = local_668;
        pVVar30 = local_6a0;
        pcVar31 = local_668;
        pVVar32 = local_680;
        goto LAB_0032e42f;
      }
    }
    if (local_610.fpclass == cpp_dec_float_NaN) {
LAB_0032e957:
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_6d8._0_8_ = local_6d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6d8,"XMAISM02 This should never happen.","");
      *puVar20 = &PTR__SPxException_003af870;
      puVar20[1] = puVar20 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar20 + 1),local_6d8._0_8_,
                 (undefined1 *)(local_6d8._0_8_ + local_6d8._8_8_));
      *puVar20 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    VVar33 = ON_UPPER;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (-1 < iVar18) goto LAB_0032e957;
    iVar18 = local_698->m_j;
    pnVar5 = (local_6a0->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
         *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    uVar8 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 6);
    puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar26 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar26 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar18].m_backend.exp = (local_698->m_upper).m_backend.exp;
    pnVar5[iVar18].m_backend.neg = (local_698->m_upper).m_backend.neg;
    iVar10 = (local_698->m_upper).m_backend.prec_elem;
    pnVar5[iVar18].m_backend.fpclass = (local_698->m_upper).m_backend.fpclass;
    pnVar5[iVar18].m_backend.prec_elem = iVar10;
    break;
  case ON_LOWER:
    ::soplex::infinity::__tls_init();
    pnVar27 = &pZVar12->m_lower;
    pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_5d8 = (cpp_dec_float<50U,_int,_void> *)*pdVar19;
    uStack_5d0 = 0;
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,-(double)local_5d8);
    if ((((pZVar12->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar27->m_backend,(cpp_dec_float<50U,_int,_void> *)local_6d8),
       iVar18 < 1)) {
      ::soplex::infinity::__tls_init();
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 10;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems._24_5_ = 0;
      local_648.data._M_elems[7]._1_3_ = 0;
      local_648.data._M_elems._32_5_ = 0;
      local_648.data._M_elems[9]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_648,(double)local_5d8);
      if ((((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_648.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(local_698->m_upper).m_backend,&local_648), -1 < iVar18))
      goto LAB_0032e7fc;
    }
    pZVar13 = local_698;
    pnVar1 = &local_698->m_upper;
    if ((((local_698->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar27->m_backend,&pnVar1->m_backend), iVar18 == 0))
    goto LAB_0032e3be;
    if (local_610.fpclass != cpp_dec_float_NaN) {
      VVar33 = ON_UPPER;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
      piVar24 = local_670;
      iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
      if (0 < iVar18) {
        iVar18 = local_698->m_j;
        pnVar5 = (local_6a0->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
             *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 8);
        uVar7 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        uVar8 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 2);
        uVar9 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 6);
        puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar26 = *(undefined8 *)((pZVar13->m_upper).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar26 + 2) = uVar9;
        *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
        pnVar5[iVar18].m_backend.exp = (local_698->m_upper).m_backend.exp;
        pnVar5[iVar18].m_backend.neg = (local_698->m_upper).m_backend.neg;
        iVar10 = (local_698->m_upper).m_backend.prec_elem;
        pnVar5[iVar18].m_backend.fpclass = (local_698->m_upper).m_backend.fpclass;
        pnVar5[iVar18].m_backend.prec_elem = iVar10;
        ppVVar29 = &local_678->data;
        pcVar22 = local_668;
        pVVar30 = local_6a0;
        pcVar31 = local_668;
        pVVar32 = local_680;
        goto LAB_0032e42f;
      }
    }
    if (local_610.fpclass == cpp_dec_float_NaN) {
LAB_0032e8cf:
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_6d8._0_8_ = local_6d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6d8,"XMAISM01 This should never happen.","");
      *puVar20 = &PTR__SPxException_003af870;
      puVar20[1] = puVar20 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar20 + 1),local_6d8._0_8_,
                 (undefined1 *)(local_6d8._0_8_ + local_6d8._8_8_));
      *puVar20 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
    iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
    if (-1 < iVar18) goto LAB_0032e8cf;
    iVar18 = local_698->m_j;
    pnVar5 = (local_6a0->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
         *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)(pnVar27->m_backend).data._M_elems;
    uVar8 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 2);
    uVar9 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
    puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar26 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar26 + 2) = uVar9;
    *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar18].m_backend.exp = (local_698->m_lower).m_backend.exp;
    pnVar5[iVar18].m_backend.neg = (local_698->m_lower).m_backend.neg;
    iVar10 = (local_698->m_lower).m_backend.prec_elem;
    pnVar5[iVar18].m_backend.fpclass = (local_698->m_lower).m_backend.fpclass;
    pnVar5[iVar18].m_backend.prec_elem = iVar10;
    VVar33 = ON_LOWER;
    break;
  case FIXED:
    ::soplex::infinity::__tls_init();
    pnVar27 = &pZVar12->m_lower;
    pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_5d8 = (cpp_dec_float<50U,_int,_void> *)*pdVar19;
    uStack_5d0 = 0;
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,-(double)local_5d8);
    if ((((pZVar12->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar27->m_backend,(cpp_dec_float<50U,_int,_void> *)local_6d8),
       iVar18 < 1)) {
      ::soplex::infinity::__tls_init();
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 10;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems._24_5_ = 0;
      local_648.data._M_elems[7]._1_3_ = 0;
      local_648.data._M_elems._32_5_ = 0;
      local_648.data._M_elems[9]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_648,(double)local_5d8);
      if ((((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_648.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(local_698->m_upper).m_backend,&local_648), -1 < iVar18))
      goto LAB_0032e7fc;
    }
    pnVar1 = &local_698->m_upper;
    local_418 = (int *)0xa00000000;
    local_448._0_16_ = (undefined1  [16])0x0;
    local_448._16_4_ = 0;
    local_448._20_4_ = 0;
    local_448._24_5_ = 0;
    local_448._29_3_ = 0;
    local_448._32_4_ = 0;
    local_448._36_4_ = 0;
    local_448._40_4_ = 0;
    local_448[0x2c] = false;
    pcVar22 = &pnVar27->m_backend;
    if (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_448 != pnVar1) &&
       (pcVar22 = &pnVar1->m_backend,
       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_448 != pnVar27)) {
      local_448._32_8_ = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
      local_448._0_16_ = *(undefined1 (*) [16])(pnVar27->m_backend).data._M_elems;
      local_448._16_8_ = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 4);
      uVar7 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
      local_448._24_5_ = (undefined5)uVar7;
      local_448._29_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_448._40_4_ = (local_698->m_lower).m_backend.exp;
      local_448[0x2c] = (local_698->m_lower).m_backend.neg;
      local_418 = *(int **)&(local_698->m_lower).m_backend.fpclass;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)local_448,pcVar22);
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 10;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems._24_5_ = 0;
    local_648.data._M_elems[7]._1_3_ = 0;
    local_648.data._M_elems._32_5_ = 0;
    local_648.data._M_elems[9]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    local_6a8 = (int *)0xa00000000;
    local_6d8._0_16_ = (undefined1  [16])0x0;
    local_6d8._16_4_ = 0;
    local_6d8._20_4_ = 0;
    local_6d8._24_5_ = 0;
    local_6d8._29_3_ = 0;
    local_6d8._32_5_ = 0;
    local_6d8._37_3_ = 0;
    local_6d8._40_4_ = 0;
    local_6d8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6d8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_648,(cpp_dec_float<50U,_int,_void> *)local_448,
               (cpp_dec_float<50U,_int,_void> *)local_6d8);
    iVar18 = *(int *)local_668;
    pnVar5 = (local_6a0->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
         CONCAT35(local_648.data._M_elems[9]._1_3_,local_648.data._M_elems._32_5_);
    puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar26 = local_648.data._M_elems._16_8_;
    *(ulong *)(puVar26 + 2) =
         CONCAT35(local_648.data._M_elems[7]._1_3_,local_648.data._M_elems._24_5_);
    *(undefined8 *)&pnVar5[iVar18].m_backend.data = local_648.data._M_elems._0_8_;
    *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = local_648.data._M_elems._8_8_;
    pnVar5[iVar18].m_backend.exp = local_648.exp;
    pnVar5[iVar18].m_backend.neg = local_648.neg;
    pnVar5[iVar18].m_backend.fpclass = local_648.fpclass;
    pnVar5[iVar18].m_backend.prec_elem = local_648.prec_elem;
    VVar33 = FIXED;
    break;
  case ZERO:
    goto switchD_0032d5d1_caseD_3;
  case BASIC:
    local_318 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
    local_338 = *(uint (*) [2])(pZVar12->m_lower).m_backend.data._M_elems;
    auStack_330 = *(uint (*) [2])((pZVar12->m_lower).m_backend.data._M_elems + 2);
    local_328 = *(uint (*) [2])((pZVar12->m_lower).m_backend.data._M_elems + 4);
    uStack_320 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
    iVar18 = (pZVar12->m_lower).m_backend.exp;
    bVar3 = (pZVar12->m_lower).m_backend.neg;
    local_348[1]._1_3_ = local_588._37_3_;
    local_348._0_5_ = local_588._32_5_;
    uStack_350 = CONCAT35(local_588._29_3_,local_588._24_5_);
    local_358[0] = local_588._16_4_;
    local_358[1] = local_588._20_4_;
    local_368[0] = local_588._0_4_;
    local_368[1] = local_588._4_4_;
    auStack_360[0] = local_588._8_4_;
    auStack_360[1] = local_588._12_4_;
    local_5d8 = (cpp_dec_float<50U,_int,_void> *)CONCAT71(local_5d8._1_7_,local_588[0x2c]);
    uVar8._0_4_ = (pZVar12->m_lower).m_backend.fpclass;
    uVar8._4_4_ = (pZVar12->m_lower).m_backend.prec_elem;
    (*(pZVar12->super_PostStep)._vptr_PostStep[6])(local_68,pZVar12);
    local_648.data._M_elems[0] = local_338[0];
    local_648.data._M_elems[1] = local_338[1];
    local_648.data._M_elems[2] = auStack_330[0];
    local_648.data._M_elems[3] = auStack_330[1];
    local_648.data._M_elems[4] = local_328[0];
    local_648.data._M_elems[5] = local_328[1];
    local_648.data._M_elems._24_5_ = SUB85(uStack_320,0);
    local_648.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_320 >> 0x28);
    local_648.data._M_elems._32_5_ = SUB85(local_318,0);
    local_648.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_318 >> 0x28);
    local_448._8_4_ = auStack_360[0];
    local_448._12_4_ = auStack_360[1];
    local_448._0_4_ = local_368[0];
    local_448._4_4_ = local_368[1];
    local_448._16_4_ = local_358[0];
    local_448._20_4_ = local_358[1];
    local_448._24_5_ = (undefined5)uStack_350;
    local_448._29_3_ = (undefined3)((ulong)uStack_350 >> 0x28);
    local_448._32_4_ = local_348[0];
    local_448._36_4_ = local_348[1];
    local_448._40_4_ = uVar15;
    local_448[0x2c] = (bool)(char)local_5d8;
    local_418 = piVar17;
    local_648.exp = iVar18;
    local_648.neg = bVar3;
    local_648._48_8_ = uVar8;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_6d8,(soplex *)&local_648,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_448,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)puVar26);
    pZVar12 = local_698;
    local_408.data._M_elems[0] = local_68[0];
    local_408.data._M_elems[1] = local_68[1];
    uVar7 = local_408.data._M_elems._0_8_;
    local_408.data._M_elems[2] = auStack_60[0];
    local_408.data._M_elems[3] = auStack_60[1];
    local_408.data._M_elems[8] = local_48[0];
    local_408.data._M_elems[9] = local_48[1];
    local_408.data._M_elems[4] = local_58[0];
    local_408.data._M_elems[5] = local_58[1];
    local_408.data._M_elems[6] = auStack_50[0];
    local_408.data._M_elems[7] = auStack_50[1];
    local_408.exp = local_40;
    uVar28 = (undefined7)((ulong)puVar26 >> 8);
    pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT71(uVar28,local_3c);
    local_408.neg = (bool)local_3c;
    local_408.fpclass = local_38;
    local_408.prec_elem = iStack_34;
    local_408.data._M_elems[0] = local_68[0];
    if (local_408.data._M_elems[0] != 0 || (fpclass_type)_local_38 != cpp_dec_float_finite) {
      pnVar27 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(CONCAT71(uVar28,local_3c) ^ 1);
      local_408.neg = SUB81(pnVar27,0);
    }
    pnVar1 = &local_698->m_lower;
    local_408.data._M_elems._0_8_ = uVar7;
    if ((((fpclass_type)_local_38 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
       (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_408),
       pcVar22 = local_668, iVar18 < 1)) {
LAB_0032dc85:
      piVar24 = local_598;
      bVar16 = local_5c8[0x2c];
      local_378 = *(undefined8 *)((pZVar12->m_upper).m_backend.data._M_elems + 8);
      local_398 = *(uint (*) [2])(pZVar12->m_upper).m_backend.data._M_elems;
      auStack_390 = *(uint (*) [2])((pZVar12->m_upper).m_backend.data._M_elems + 2);
      local_388 = *(uint (*) [2])((pZVar12->m_upper).m_backend.data._M_elems + 4);
      uStack_380 = *(undefined8 *)((pZVar12->m_upper).m_backend.data._M_elems + 6);
      iVar18 = (pZVar12->m_upper).m_backend.exp;
      bVar3 = (pZVar12->m_upper).m_backend.neg;
      local_3a8[1]._1_3_ = local_5c8._37_3_;
      local_3a8._0_5_ = local_5c8._32_5_;
      uStack_3b0 = CONCAT35(local_5c8._29_3_,local_5c8._24_5_);
      local_3b8[0] = local_5c8._16_4_;
      local_3b8[1] = local_5c8._20_4_;
      local_3c8[0] = local_5c8._0_4_;
      local_3c8[1] = local_5c8._4_4_;
      lStack_3c0 = local_5c8._8_8_;
      local_5d8 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_5d8._4_4_,local_5c8._40_4_);
      uVar9._0_4_ = (pZVar12->m_upper).m_backend.fpclass;
      uVar9._4_4_ = (pZVar12->m_upper).m_backend.prec_elem;
      (*(pZVar12->super_PostStep)._vptr_PostStep[6])(&local_180,pZVar12);
      local_648.data._M_elems[0] = local_398[0];
      local_648.data._M_elems[1] = local_398[1];
      local_648.data._M_elems[2] = auStack_390[0];
      local_648.data._M_elems[3] = auStack_390[1];
      local_648.data._M_elems[4] = local_388[0];
      local_648.data._M_elems[5] = local_388[1];
      local_648.data._M_elems._24_5_ = SUB85(uStack_380,0);
      local_648.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_380 >> 0x28);
      local_648.data._M_elems._32_5_ = SUB85(local_378,0);
      local_648.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_378 >> 0x28);
      local_448._8_8_ = lStack_3c0;
      local_448._0_4_ = local_3c8[0];
      local_448._4_4_ = local_3c8[1];
      local_448._16_4_ = local_3b8[0];
      local_448._20_4_ = local_3b8[1];
      local_448._24_5_ = (undefined5)uStack_3b0;
      local_448._29_3_ = (undefined3)((ulong)uStack_3b0 >> 0x28);
      local_448._32_4_ = local_3a8[0];
      local_448._36_4_ = local_3a8[1];
      local_448._40_4_ = (int)local_5d8;
      local_448[0x2c] = bVar16;
      local_418 = piVar24;
      local_648.exp = iVar18;
      local_648.neg = bVar3;
      local_648._48_8_ = uVar9;
      relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_6d8,(soplex *)&local_648,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_448,pnVar27);
      pVVar32 = local_680;
      piVar24 = local_670;
      if ((((fpclass_type)local_6a8 != cpp_dec_float_NaN) &&
          (local_180.fpclass != cpp_dec_float_NaN)) &&
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_180),
         piVar24 = local_670, pVVar32 = local_680, iVar18 < 1)) {
        ::soplex::infinity::__tls_init();
        pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
        local_6a8 = (int *)0xa00000000;
        local_6d8._0_4_ = 0;
        local_6d8._4_4_ = 0;
        local_6d8._8_8_ = 0;
        local_6d8._16_4_ = 0;
        local_6d8._20_4_ = 0;
        local_6d8._24_5_ = 0;
        local_6d8._29_3_ = 0;
        local_6d8._32_5_ = 0;
        local_6d8._37_3_ = 0;
        local_6d8._40_4_ = 0;
        local_6d8[0x2c] = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6d8,*pdVar19);
        pZVar12 = local_698;
        if (((local_698->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
           ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) {
          local_5d8 = &(local_698->m_upper).m_backend;
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (local_5d8,(cpp_dec_float<50U,_int,_void> *)local_6d8);
          if (iVar18 < 0) {
            iVar18 = pZVar12->m_j;
            pnVar5 = (local_6a0->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
                 *(undefined8 *)((local_5d8->data)._M_elems + 8);
            uVar7 = *(undefined8 *)(local_5d8->data)._M_elems;
            uVar8 = *(undefined8 *)((local_5d8->data)._M_elems + 2);
            uVar9 = *(undefined8 *)((local_5d8->data)._M_elems + 6);
            puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar26 = *(undefined8 *)((local_5d8->data)._M_elems + 4);
            *(undefined8 *)(puVar26 + 2) = uVar9;
            *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
            *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
            pnVar5[iVar18].m_backend.exp = (pZVar12->m_upper).m_backend.exp;
            pnVar5[iVar18].m_backend.neg = (pZVar12->m_upper).m_backend.neg;
            iVar10 = (pZVar12->m_upper).m_backend.prec_elem;
            pnVar5[iVar18].m_backend.fpclass = (pZVar12->m_upper).m_backend.fpclass;
            pnVar5[iVar18].m_backend.prec_elem = iVar10;
            VVar33 = ON_UPPER;
            pcVar22 = local_668;
            if (((pZVar12->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
               ((pZVar12->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
              iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&pnVar1->m_backend,local_5d8);
              VVar33 = (uint)(iVar18 == 0) * 2;
              pcVar22 = local_668;
            }
            goto LAB_0032e83f;
          }
        }
      }
      ::soplex::infinity::__tls_init();
      ppVVar29 = &rStatus->data;
      puVar21 = (ulong *)__tls_get_addr(&PTR_003b6b60);
      local_698 = (ZeroObjColSingletonPS *)*puVar21;
      uStack_690 = 0;
      local_6a8 = (int *)0xa00000000;
      local_6d8._0_16_ = (undefined1  [16])0x0;
      local_6d8._16_4_ = 0;
      local_6d8._20_4_ = 0;
      local_6d8._24_5_ = 0;
      local_6d8._29_3_ = 0;
      local_6d8._32_5_ = 0;
      local_6d8._37_3_ = 0;
      local_6d8._40_4_ = 0;
      local_6d8[0x2c] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_6d8,-(double)local_698);
      pcVar31 = local_668;
      pcVar22 = (cpp_dec_float<50U,_int,_void> *)piVar24;
      if ((((fpclass_type)local_558 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_588,
                              (cpp_dec_float<50U,_int,_void> *)local_6d8), iVar18 < 1)) {
        ::soplex::infinity::__tls_init();
        local_6a8 = (int *)0xa00000000;
        local_6d8._0_16_ = (undefined1  [16])0x0;
        local_6d8._16_4_ = 0;
        local_6d8._20_4_ = 0;
        local_6d8._24_5_ = 0;
        local_6d8._29_3_ = 0;
        local_6d8._32_5_ = 0;
        local_6d8._37_3_ = 0;
        local_6d8._40_4_ = 0;
        local_6d8[0x2c] = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6d8,(double)local_698);
        if ((((fpclass_type)local_598 == cpp_dec_float_NaN) ||
            ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
           (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_5c8,
                                (cpp_dec_float<50U,_int,_void> *)local_6d8), -1 < iVar18)) {
          puVar20 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_6d8._0_8_ = local_6d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6d8,"XMAISM03 This should never happen.","");
          *puVar20 = &PTR__SPxException_003af870;
          puVar20[1] = puVar20 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar20 + 1),local_6d8._0_8_,
                     (undefined1 *)(local_6d8._0_8_ + local_6d8._8_8_));
          *puVar20 = &PTR__SPxException_003b0638;
          __cxa_throw(puVar20,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        iVar18 = *(int *)pcVar31;
        pnVar5 = (local_6a0->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
             CONCAT35(local_5c8._37_3_,local_5c8._32_5_);
        puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar26 = local_5c8._16_8_;
        *(ulong *)(puVar26 + 2) = CONCAT35(local_5c8._29_3_,local_5c8._24_5_);
        *(undefined8 *)&pnVar5[iVar18].m_backend.data = local_5c8._0_8_;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = local_5c8._8_8_;
        pnVar5[iVar18].m_backend.exp = local_5c8._40_4_;
        pnVar5[iVar18].m_backend.neg = local_5c8[0x2c];
        *(int **)&pnVar5[iVar18].m_backend.fpclass = local_598;
        local_678->data[*(int *)pcVar31] = BASIC;
        VVar33 = ON_LOWER;
        pVVar30 = local_6a0;
        if (local_610.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
          piVar24 = local_670;
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
          VVar33 = (VarStatus)(iVar18 < 1);
          pcVar22 = (cpp_dec_float<50U,_int,_void> *)piVar24;
          pVVar30 = local_6a0;
        }
      }
      else {
        iVar18 = *(int *)pcVar31;
        pnVar5 = (local_6a0->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
             CONCAT35(local_588._37_3_,local_588._32_5_);
        puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar26 = local_588._16_8_;
        *(ulong *)(puVar26 + 2) = CONCAT35(local_588._29_3_,local_588._24_5_);
        *(undefined8 *)&pnVar5[iVar18].m_backend.data = local_588._0_8_;
        *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = local_588._8_8_;
        pnVar5[iVar18].m_backend.exp = local_588._40_4_;
        pnVar5[iVar18].m_backend.neg = local_588[0x2c];
        *(int **)&pnVar5[iVar18].m_backend.fpclass = local_558;
        local_678->data[*(int *)pcVar31] = BASIC;
        VVar33 = ON_UPPER;
        pVVar30 = local_6a0;
        if (local_610.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
          piVar24 = local_670;
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_610,(cpp_dec_float<50U,_int,_void> *)local_6d8);
          VVar33 = (VarStatus)(0 < iVar18);
          pcVar22 = (cpp_dec_float<50U,_int,_void> *)piVar24;
          pVVar30 = local_6a0;
        }
      }
    }
    else {
      ::soplex::infinity::__tls_init();
      pdVar19 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_6a8 = (int *)0xa00000000;
      local_6d8._0_4_ = 0;
      local_6d8._4_4_ = 0;
      local_6d8._8_8_ = 0;
      local_6d8._16_4_ = 0;
      local_6d8._20_4_ = 0;
      local_6d8._24_5_ = 0;
      local_6d8._29_3_ = 0;
      local_6d8._32_5_ = 0;
      local_6d8._37_3_ = 0;
      local_6d8._40_4_ = 0;
      local_6d8[0x2c] = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_6d8,-*pdVar19);
      if ((((pZVar12->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
          ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
         (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar1->m_backend,(cpp_dec_float<50U,_int,_void> *)local_6d8),
         piVar24 = local_670, pVVar32 = local_680, iVar18 < 1)) goto LAB_0032dc85;
      iVar18 = pZVar12->m_j;
      pnVar5 = (local_6a0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
           *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 8);
      uVar7 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      uVar8 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 2);
      uVar9 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 6);
      puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar26 = *(undefined8 *)((pZVar12->m_lower).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar26 + 2) = uVar9;
      *(undefined8 *)&pnVar5[iVar18].m_backend.data = uVar7;
      *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = uVar8;
      pnVar5[iVar18].m_backend.exp = (pZVar12->m_lower).m_backend.exp;
      pnVar5[iVar18].m_backend.neg = (pZVar12->m_lower).m_backend.neg;
      iVar10 = (pZVar12->m_lower).m_backend.prec_elem;
      pnVar5[iVar18].m_backend.fpclass = (pZVar12->m_lower).m_backend.fpclass;
      pnVar5[iVar18].m_backend.prec_elem = iVar10;
      VVar33 = ON_LOWER;
      if (((pZVar12->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
         ((pZVar12->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar1->m_backend,&(pZVar12->m_upper).m_backend);
        VVar33 = (iVar18 == 0) + ON_LOWER;
      }
LAB_0032e83f:
      ppVVar29 = &local_678->data;
      pVVar30 = local_6a0;
      pcVar31 = pcVar22;
    }
    goto LAB_0032e42f;
  }
  ppVVar29 = &local_678->data;
  pcVar22 = local_668;
  pVVar30 = local_6a0;
  pcVar31 = local_668;
  pVVar32 = local_680;
  piVar24 = local_670;
LAB_0032e42f:
  (*ppVVar29)[*(int *)pcVar22] = VVar33;
  pcVar31 = &(pVVar30->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(int *)pcVar31].m_backend;
  local_6a8 = (int *)0xa00000000;
  local_6d8._0_16_ = (undefined1  [16])0x0;
  local_6d8._16_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._24_5_ = 0;
  local_6d8._29_3_ = 0;
  local_6d8._32_5_ = 0;
  local_6d8._37_3_ = 0;
  local_6d8._40_4_ = 0;
  local_6d8[0x2c] = false;
  pcVar22 = &local_610;
  if ((cpp_dec_float<50U,_int,_void> *)local_6d8 != pcVar31) {
    local_6d8._32_5_ = local_610.data._M_elems._32_5_;
    local_6d8._37_3_ = local_610.data._M_elems[9]._1_3_;
    local_6d8._16_4_ = local_610.data._M_elems[4];
    local_6d8._20_4_ = local_610.data._M_elems[5];
    local_6d8._24_5_ = local_610.data._M_elems._24_5_;
    local_6d8._29_3_ = local_610.data._M_elems[7]._1_3_;
    local_6d8._8_4_ = local_610.data._M_elems[2];
    local_6d8._12_4_ = local_610.data._M_elems[3];
    local_6d8._0_4_ = local_610.data._M_elems[0];
    local_6d8._4_4_ = local_610.data._M_elems[1];
    local_6d8._40_4_ = local_610.exp;
    local_6d8[0x2c] = local_610.neg;
    local_6a8._4_4_ = local_610.prec_elem;
    local_6a8._0_4_ = local_610.fpclass;
    pcVar22 = pcVar31;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar22);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(local_650->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar24].m_backend,
             (cpp_dec_float<50U,_int,_void> *)local_6d8);
  local_648.fpclass = cpp_dec_float_finite;
  local_648.prec_elem = 10;
  local_648.data._M_elems[0] = 0;
  local_648.data._M_elems[1] = 0;
  local_648.data._M_elems[2] = 0;
  local_648.data._M_elems[3] = 0;
  local_648.data._M_elems[4] = 0;
  local_648.data._M_elems[5] = 0;
  local_648.data._M_elems._24_5_ = 0;
  local_648.data._M_elems[7]._1_3_ = 0;
  local_648.data._M_elems._32_5_ = 0;
  local_648.data._M_elems[9]._1_3_ = 0;
  local_648.exp = 0;
  local_648.neg = false;
  local_6a8 = (int *)0xa00000000;
  local_6d8._0_16_ = (undefined1  [16])0x0;
  local_6d8._16_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._24_5_ = 0;
  local_6d8._29_3_ = 0;
  local_6d8._32_5_ = 0;
  local_6d8._37_3_ = 0;
  local_6d8._40_4_ = 0;
  local_6d8[0x2c] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_6d8,-1.0);
  local_648.data._M_elems[0] = local_610.data._M_elems[0];
  local_648.data._M_elems[1] = local_610.data._M_elems[1];
  local_648.data._M_elems[2] = local_610.data._M_elems[2];
  local_648.data._M_elems[3] = local_610.data._M_elems[3];
  local_648.data._M_elems[4] = local_610.data._M_elems[4];
  local_648.data._M_elems[5] = local_610.data._M_elems[5];
  local_648.data._M_elems._24_5_ = local_610.data._M_elems._24_5_;
  local_648.data._M_elems[7]._1_3_ = local_610.data._M_elems[7]._1_3_;
  local_648.data._M_elems._32_5_ = local_610.data._M_elems._32_5_;
  local_648.data._M_elems[9]._1_3_ = local_610.data._M_elems[9]._1_3_;
  local_648.exp = local_610.exp;
  local_648.neg = local_610.neg;
  local_648.prec_elem = local_610.prec_elem;
  local_648.fpclass = local_610.fpclass;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&local_648,(cpp_dec_float<50U,_int,_void> *)local_6d8);
  pcVar31 = &(local_4d0->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar24].m_backend;
  local_6a8 = (int *)0xa00000000;
  local_6d8._0_4_ = 0;
  local_6d8._4_4_ = 0;
  local_6d8._8_4_ = 0;
  local_6d8._12_4_ = 0;
  local_6d8._16_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._24_5_ = 0;
  local_6d8._29_3_ = 0;
  local_6d8._32_5_ = 0;
  local_6d8._37_3_ = 0;
  local_6d8._40_4_ = 0;
  local_6d8[0x2c] = false;
  pcVar22 = &local_648;
  if ((cpp_dec_float<50U,_int,_void> *)local_6d8 != pcVar31) {
    local_6d8._32_5_ = local_648.data._M_elems._32_5_;
    local_6d8._37_3_ = local_648.data._M_elems[9]._1_3_;
    local_6d8._16_4_ = local_648.data._M_elems[4];
    local_6d8._20_4_ = local_648.data._M_elems[5];
    local_6d8._24_5_ = local_648.data._M_elems._24_5_;
    local_6d8._29_3_ = local_648.data._M_elems[7]._1_3_;
    local_6d8._0_4_ = local_648.data._M_elems[0];
    local_6d8._4_4_ = local_648.data._M_elems[1];
    local_6d8._8_4_ = local_648.data._M_elems[2];
    local_6d8._12_4_ = local_648.data._M_elems[3];
    local_6d8._40_4_ = local_648.exp;
    local_6d8[0x2c] = local_648.neg;
    local_6a8 = (int *)local_648._48_8_;
    pcVar22 = pcVar31;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar22);
  iVar18 = *(int *)local_668;
  pnVar5 = (pVVar32->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar18].m_backend.data._M_elems + 8) =
       CONCAT35(local_6d8._37_3_,local_6d8._32_5_);
  puVar26 = pnVar5[iVar18].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar26 = local_6d8._16_8_;
  *(ulong *)(puVar26 + 2) = CONCAT35(local_6d8._29_3_,local_6d8._24_5_);
  *(undefined8 *)&pnVar5[iVar18].m_backend.data = local_6d8._0_8_;
  *(undefined8 *)(pnVar5[iVar18].m_backend.data._M_elems + 2) = local_6d8._8_8_;
  pnVar5[iVar18].m_backend.exp = local_6d8._40_4_;
  pnVar5[iVar18].m_backend.neg = local_6d8[0x2c];
  *(int **)&pnVar5[iVar18].m_backend.fpclass = local_6a8;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}